

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint ** gf_matr_mul(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint b_00;
  uint uVar1;
  uint **ppuVar2;
  uint local_3c;
  uint local_38;
  uint _k;
  uint j;
  uint i;
  uint **c;
  uint b_cols_local;
  uint b_rows_local;
  uint **b_local;
  uint a_cols_local;
  uint a_rows_local;
  uint **a_local;
  
  if (a_cols != b_rows) {
    fatal((uchar *)"gf_matr_mul",(uchar *)" a_cols != b_rows\n");
  }
  ppuVar2 = matrix_new(a_rows,b_cols);
  for (_k = 0; _k < a_rows; _k = _k + 1) {
    for (local_38 = 0; local_38 < b_cols; local_38 = local_38 + 1) {
      ppuVar2[_k][local_38] = 0;
      for (local_3c = 0; local_3c < b_rows; local_3c = local_3c + 1) {
        uVar1 = ppuVar2[_k][local_38];
        b_00 = gf_mul(a[_k][local_3c],b[local_3c][local_38]);
        uVar1 = gf_sum(uVar1,b_00);
        ppuVar2[_k][local_38] = uVar1;
      }
    }
  }
  return ppuVar2;
}

Assistant:

uint32_t **gf_matr_mul(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
                  uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_cols != b_rows)
        fatal("gf_matr_mul", " a_cols != b_rows\n");

    uint32_t **c = matrix_new(a_rows, b_cols);
    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < b_cols; j++)
        {
            c[i][j] = 0;
            for (uint32_t _k = 0; _k < b_rows; _k++)
                c[i][j] = gf_sum(c[i][j], gf_mul(a[i][_k], b[_k][j]));
        }

    return c;
}